

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

int QTest::qExec(QObject *testObject,QStringList *arguments)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_898;
  QArrayDataPointer<char> local_880;
  QArrayDataPointer<QByteArray> local_868;
  QVarLengthArray<char_*,_256LL> argv;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = (arguments->d).size;
  memset(&argv,0xaa,0x818);
  iVar2 = (int)uVar7;
  QVarLengthArray<char_*,_256LL>::QVarLengthArray(&argv,(long)iVar2);
  local_868.d = (Data *)0x0;
  local_868.ptr = (QByteArray *)0x0;
  local_868.size = 0;
  QList<QByteArray>::reserve((QList<QByteArray> *)&local_868,(long)iVar2);
  lVar6 = 0;
  uVar4 = 0;
  if (0 < iVar2) {
    uVar4 = uVar7 & 0xffffffff;
  }
  for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    QString::toLocal8Bit
              ((QByteArray *)&local_898,(QString *)((long)&(((arguments->d).ptr)->d).d + lVar6));
    pcVar5 = local_898.ptr;
    if (local_898.ptr == (char *)0x0) {
      pcVar5 = (char *)&QByteArray::_empty;
    }
    QByteArray::QByteArray((QByteArray *)&local_880,pcVar5,-1);
    QList<QByteArray>::emplaceBack<QByteArray>
              ((QList<QByteArray> *)&local_868,(QByteArray *)&local_880);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_880);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_898);
    iVar3 = QList<QByteArray>::end((QList<QByteArray> *)&local_868);
    pcVar5 = QByteArray::data(iVar3.i + -1);
    *(char **)((long)argv.super_QVLABase<char_*>.super_QVLABaseBase.ptr + uVar7 * 8) = pcVar5;
    lVar6 = lVar6 + 0x18;
  }
  iVar2 = qExec(testObject,iVar2,(char **)argv.super_QVLABase<char_*>.super_QVLABaseBase.ptr);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_868);
  QVarLengthArray<char_*,_256LL>::~QVarLengthArray(&argv);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QTest::qExec(QObject *testObject, const QStringList &arguments)
{
    const int argc = arguments.size();
    QVarLengthArray<char *> argv(argc);

    QList<QByteArray> args;
    args.reserve(argc);

    for (int i = 0; i < argc; ++i)
    {
        args.append(arguments.at(i).toLocal8Bit().constData());
        argv[i] = args.last().data();
    }

    return qExec(testObject, argc, argv.data());
}